

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void divide_subset_split(size_t *ix_arr,int *x,size_t st,size_t end,char *split_categ,int ncat,
                        MissingAction missing_action,NewCategAction new_cat_action,
                        bool move_new_to_left,size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  int iVar1;
  undefined8 uVar2;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  size_t *in_stack_00000030;
  int local_ac;
  int local_a8;
  int local_a4;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  size_t row_11;
  size_t row_10;
  size_t row_9;
  size_t row_8;
  size_t row_7;
  size_t row_6;
  size_t row_5;
  size_t row_4;
  size_t row_3;
  size_t row_2;
  size_t row_1;
  size_t row;
  int cval;
  size_t temp;
  
  row = in_RDX;
  if (((int)split_categ == 0) && ((int)end != 0)) {
    if (((int)end == 0xb) && (row_6 = in_RDX, (st & 1) != 0)) {
      for (; row_6 <= in_RCX; row_6 = row_6 + 1) {
        iVar1 = *(int *)(in_RSI + *(long *)(in_RDI + row_6 * 8) * 4);
        if (((in_R9D <= iVar1) || (*(char *)(in_R8 + iVar1) == '\x01')) ||
           (*(char *)(in_R8 + iVar1) == -1)) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + row_6 * 8);
          *(undefined8 *)(in_RDI + row_6 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    else {
      row_8 = in_RDX;
      row_7 = in_RDX;
      if ((int)end == 0xc) {
        for (; row_7 <= in_RCX; row_7 = row_7 + 1) {
          local_a4 = *(int *)(in_RSI + *(long *)(in_RDI + row_7 * 8) * 4);
          if (in_R9D <= local_a4) {
            local_a4 = local_a4 % in_R9D;
          }
          if (*(char *)(in_R8 + local_a4) == '\x01') {
            uVar2 = *(undefined8 *)(in_RDI + row * 8);
            *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + row_7 * 8);
            *(undefined8 *)(in_RDI + row_7 * 8) = uVar2;
            row = row + 1;
          }
        }
      }
      else {
        for (; row_8 <= in_RCX; row_8 = row_8 + 1) {
          iVar1 = *(int *)(in_RSI + *(long *)(in_RDI + row_8 * 8) * 4);
          if ((iVar1 < in_R9D) && (*(char *)(in_R8 + iVar1) == '\x01')) {
            uVar2 = *(undefined8 *)(in_RDI + row * 8);
            *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + row_8 * 8);
            *(undefined8 *)(in_RDI + row_8 * 8) = uVar2;
            row = row + 1;
          }
        }
      }
    }
    *in_stack_00000030 = row;
  }
  else if ((int)end == 0xc) {
    row_10 = in_RDX;
    if (((int)split_categ == 0x16) && (row_9 = in_RDX, (st & 1) == 0)) {
      for (; row_9 <= in_RCX; row_9 = row_9 + 1) {
        local_a8 = *(int *)(in_RSI + *(long *)(in_RDI + row_9 * 8) * 4);
        if (in_R9D <= local_a8) {
          local_a8 = local_a8 % in_R9D;
        }
        if ((local_a8 < 0) || (*(char *)(in_R8 + local_a8) == '\x01')) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + row_9 * 8);
          *(undefined8 *)(in_RDI + row_9 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    else {
      for (; row_10 <= in_RCX; row_10 = row_10 + 1) {
        local_ac = *(int *)(in_RSI + *(long *)(in_RDI + row_10 * 8) * 4);
        if (in_R9D <= local_ac) {
          local_ac = local_ac % in_R9D;
        }
        if ((-1 < local_ac) && (*(char *)(in_R8 + local_ac) == '\x01')) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + row_10 * 8);
          *(undefined8 *)(in_RDI + row_10 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    *(size_t *)x = row;
    if (((int)split_categ != 0x16) || ((st & 1) != 0)) {
      for (row_11 = row; row_11 <= in_RCX; row_11 = row_11 + 1) {
        if (*(int *)(in_RSI + *(long *)(in_RDI + row_11 * 8) * 4) < 0) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + row_11 * 8);
          *(undefined8 *)(in_RDI + row_11 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    *ix_arr = row;
  }
  else {
    if (((int)end == 0xb) && (local_78 = in_RDX, (st & 1) != 0)) {
      for (; local_78 <= in_RCX; local_78 = local_78 + 1) {
        iVar1 = *(int *)(in_RSI + *(long *)(in_RDI + local_78 * 8) * 4);
        if ((-1 < iVar1) &&
           (((in_R9D <= iVar1 || (*(char *)(in_R8 + iVar1) == '\x01')) ||
            (*(char *)(in_R8 + iVar1) == -1)))) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + local_78 * 8);
          *(undefined8 *)(in_RDI + local_78 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    else {
      local_88 = in_RDX;
      if (((int)split_categ == 0x16) && (local_80 = in_RDX, (st & 1) == 0)) {
        for (; local_80 <= in_RCX; local_80 = local_80 + 1) {
          iVar1 = *(int *)(in_RSI + *(long *)(in_RDI + local_80 * 8) * 4);
          if ((iVar1 < in_R9D) && ((iVar1 < 0 || (*(char *)(in_R8 + iVar1) == '\x01')))) {
            uVar2 = *(undefined8 *)(in_RDI + row * 8);
            *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + local_80 * 8);
            *(undefined8 *)(in_RDI + local_80 * 8) = uVar2;
            row = row + 1;
          }
        }
      }
      else {
        for (; local_88 <= in_RCX; local_88 = local_88 + 1) {
          iVar1 = *(int *)(in_RSI + *(long *)(in_RDI + local_88 * 8) * 4);
          if (((-1 < iVar1) && (iVar1 < in_R9D)) && (*(char *)(in_R8 + iVar1) == '\x01')) {
            uVar2 = *(undefined8 *)(in_RDI + row * 8);
            *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + local_88 * 8);
            *(undefined8 *)(in_RDI + local_88 * 8) = uVar2;
            row = row + 1;
          }
        }
      }
    }
    *(size_t *)x = row;
    if (((int)end == 0) && ((int)split_categ == 0x15)) {
      for (local_90 = row; local_90 <= in_RCX; local_90 = local_90 + 1) {
        iVar1 = *(int *)(in_RSI + *(long *)(in_RDI + local_90 * 8) * 4);
        if (((iVar1 < 0) || (in_R9D <= iVar1)) || (*(char *)(in_R8 + iVar1) == -1)) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + local_90 * 8);
          *(undefined8 *)(in_RDI + local_90 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    else if ((int)end == 0) {
      for (local_98 = row; local_98 <= in_RCX; local_98 = local_98 + 1) {
        iVar1 = *(int *)(in_RSI + *(long *)(in_RDI + local_98 * 8) * 4);
        if ((-1 < iVar1) && ((in_R9D <= iVar1 || (*(char *)(in_R8 + iVar1) == -1)))) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + local_98 * 8);
          *(undefined8 *)(in_RDI + local_98 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    else if ((int)split_categ == 0x15) {
      for (local_a0 = row; local_a0 <= in_RCX; local_a0 = local_a0 + 1) {
        if (*(int *)(in_RSI + *(long *)(in_RDI + local_a0 * 8) * 4) < 0) {
          uVar2 = *(undefined8 *)(in_RDI + row * 8);
          *(undefined8 *)(in_RDI + row * 8) = *(undefined8 *)(in_RDI + local_a0 * 8);
          *(undefined8 *)(in_RDI + local_a0 * 8) = uVar2;
          row = row + 1;
        }
      }
    }
    *ix_arr = row;
  }
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, int x[], size_t st, size_t end, signed char split_categ[],
                         int ncat, MissingAction missing_action, NewCategAction new_cat_action,
                         bool move_new_to_left, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;
    int cval;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail && new_cat_action != Weighted)
    {
        /* in this case, will need to fill 'split_ix', otherwise need to fill 'st_NA' and 'end_NA' */
        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= ncat || split_categ[cval] == 1 || split_categ[cval] == (-1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (new_cat_action == Random)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < ncat && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        split_ix = st;
    }

    /* if there are new categories, and their direction was decided at random,
       can just reuse what was randomly decided for previous columns by taking
       a remainder w.r.t. the number of previous columns. Note however that this
       will not be an unbiased decision if the model used a gain criterion. */
    else if (new_cat_action == Random)
    {
        if (missing_action == Impute && !move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (cval < 0 || split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (cval >= 0 && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        st_NA = st;

        if (!(missing_action == Impute && !move_new_to_left))
        {
            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        end_NA = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        /* Note: if having 'new_cat_action'='Smallest' and 'missing_action'='Impute', missing values
           and new categories will necessarily go into different branches, thus it's possible to do
           all the movements in one pass if certain conditions match. */

        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && (cval >= ncat || split_categ[cval] == 1 || split_categ[cval] == (-1)))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (missing_action == Impute && !move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < ncat && (cval < 0 || split_categ[cval] == 1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && cval < ncat && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        st_NA = st;

        if (new_cat_action == Weighted && missing_action == Divide)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < 0 || cval >= ncat || split_categ[cval] == (-1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (new_cat_action == Weighted)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && (cval >= ncat || split_categ[cval] == (-1)))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (missing_action == Divide)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        end_NA = st;
    }
}